

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O2

DynamicTypeHandler * __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::Clone
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,Recycler *recycler)

{
  Recycler *alloc;
  ES5ArrayTypeHandlerBase<unsigned_short> *this_00;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_9953769;
  data.filename._0_4_ = 0xfc;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_48);
  this_00 = (ES5ArrayTypeHandlerBase<unsigned_short> *)new<Memory::Recycler>(0x40,alloc,0x37a1d4);
  ES5ArrayTypeHandlerBase(this_00,recycler,this);
  return (DynamicTypeHandler *)this_00;
}

Assistant:

DynamicTypeHandler * ES5ArrayTypeHandlerBase<T>::Clone(Recycler * recycler)
    {
        return RecyclerNew(recycler, ES5ArrayTypeHandlerBase, recycler, this);
    }